

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

FSerializer *
Serialize<FDynamicColormap>(FSerializer *arc,char *key,FDynamicColormap **cm,FDynamicColormap **def)

{
  uint uVar1;
  FWriter *pFVar2;
  FDynamicColormap *pFVar3;
  Value *this;
  anon_union_4_2_12391d7c_for_PalEntry_0 *paVar4;
  anon_union_4_2_12391d7c_for_PalEntry_0 *paVar5;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar6;
  FDynamicColormap *pFVar7;
  
  pFVar2 = arc->w;
  if (pFVar2 == (FWriter *)0x0) {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      if ((this->data_).f.flags == 4) {
        paVar4 = (anon_union_4_2_12391d7c_for_PalEntry_0 *)
                 rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator[](this,0);
        paVar5 = (anon_union_4_2_12391d7c_for_PalEntry_0 *)
                 rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator[](this,1);
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator[](this,2);
        if ((((*(byte *)((long)paVar4 + 0x16) & 0x40) != 0) &&
            ((*(byte *)((long)paVar5 + 0x16) & 0x40) != 0)) &&
           ((*(byte *)((long)&pGVar6->data_ + 0x16) & 0x40) != 0)) {
          pFVar7 = GetSpecialLights((PalEntry)paVar4->field_0,(PalEntry)paVar5->field_0,
                                    (pGVar6->data_).s.length);
          *cm = pFVar7;
          return arc;
        }
      }
      __assert_fail("false && \"not a colormap\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                    ,0x6d3,
                    "FSerializer &Serialize(FSerializer &, const char *, FDynamicColormap *&, FDynamicColormap **)"
                   );
    }
  }
  else {
    uVar1 = (pFVar2->mInObject).Count;
    if (((uVar1 != 0) && (def != (FDynamicColormap **)0x0)) &&
       ((pFVar2->mInObject).Array[uVar1 - 1] != false)) {
      pFVar7 = *cm;
      pFVar3 = *def;
      if ((((pFVar7->Color).field_0.d == (pFVar3->Color).field_0.d) &&
          ((pFVar7->Fade).field_0.d == (pFVar3->Fade).field_0.d)) &&
         (pFVar7->Desaturate == pFVar3->Desaturate)) {
        return arc;
      }
    }
    FSerializer::WriteKey(arc,key);
    FWriter::StartArray(arc->w);
    FWriter::Uint(arc->w,((*cm)->Color).field_0.d);
    FWriter::Uint(arc->w,((*cm)->Fade).field_0.d);
    FWriter::Uint(arc->w,(*cm)->Desaturate);
    FWriter::EndArray(arc->w);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FDynamicColormap *&cm, FDynamicColormap **def)
{
	if (arc.isWriting())
	{
		if (arc.w->inObject() && def != nullptr && cm->Color == (*def)->Color && cm->Fade == (*def)->Fade && cm->Desaturate == (*def)->Desaturate)
		{
			return arc;
		}

		arc.WriteKey(key);
		arc.w->StartArray();
		arc.w->Uint(cm->Color);
		arc.w->Uint(cm->Fade);
		arc.w->Uint(cm->Desaturate);
		arc.w->EndArray();
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsArray())
			{
				const rapidjson::Value &colorval = (*val)[0];
				const rapidjson::Value &fadeval = (*val)[1];
				const rapidjson::Value &desatval = (*val)[2];
				if (colorval.IsUint() && fadeval.IsUint() && desatval.IsUint())
				{
					cm = GetSpecialLights(colorval.GetUint(), fadeval.GetUint(), desatval.GetUint());
					return arc;
				}
			}
			assert(false && "not a colormap");
			Printf(TEXTCOLOR_RED "object does not represent a colormap for '%s'", key);
			cm = &NormalLight;
		}
	}
	return arc;
}